

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::ParsedScene::AreaLightSource
          (ParsedScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  GraphicsState *pGVar1;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  char *fmt;
  ParameterDictionary PStack_e8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_80;
  
  if (this->currentApiState == OptionsBlock) {
    fmt = "Scene description must be inside world block; \"%s\" not allowed. Ignoring.";
  }
  else {
    if (this->currentApiState != Uninitialized) {
      std::__cxx11::string::_M_assign((string *)&this->graphicsState->areaLightName);
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::InlinedVector(&local_80,in_RDX);
      ParameterDictionary::ParameterDictionary
                (&PStack_e8,&local_80,&this->graphicsState->lightAttributes,
                 this->graphicsState->colorSpace);
      ParameterDictionary::operator=(&this->graphicsState->areaLightParams,&PStack_e8);
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::~InlinedVector(&PStack_e8.params);
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::~InlinedVector(&local_80);
      pGVar1 = this->graphicsState;
      *(ParsedParameter **)&(pGVar1->areaLightLoc).line = params.field_2.fixed[0];
      (pGVar1->areaLightLoc).filename._M_len = (size_t)params.alloc.memoryResource;
      (pGVar1->areaLightLoc).filename._M_str = (char *)params.ptr;
      return;
    }
    fmt = "pbrtInit() must be before calling \"%s()\". Ignoring.";
  }
  Error<char_const(&)[16]>((FileLoc *)&params,fmt,(char (*) [16])"AreaLightSource");
  return;
}

Assistant:

void ParsedScene::AreaLightSource(const std::string &name, ParsedParameterVector params,
                                  FileLoc loc) {
    VERIFY_WORLD("AreaLightSource");
    graphicsState->areaLightName = name;
    graphicsState->areaLightParams = ParameterDictionary(
        std::move(params), graphicsState->lightAttributes, graphicsState->colorSpace);
    graphicsState->areaLightLoc = loc;
}